

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtilizationWidget.cpp
# Opt level: O3

void __thiscall UtilizationWidget::drawGraph(UtilizationWidget *this)

{
  vector<Point<float>,_std::allocator<Point<float>_>_> *points_00;
  undefined8 uVar1;
  vector<Point<float>,_std::allocator<Point<float>_>_> *pvVar2;
  float *pfVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  QColor *pQVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  QPen pen;
  anon_class_4_1_24fd66d6 xPos;
  QColor color;
  anon_class_4_1_60e07675 yPos;
  vector<Point<float>,_std::allocator<Point<float>_>_> points;
  anon_class_32_4_58ce38c5 drawGraph;
  undefined1 auStack_b8 [12];
  anon_class_4_1_24fd66d6 local_ac;
  QColor local_a8;
  PointF local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  anon_class_4_1_60e07675 local_6c;
  vector<Point<float>,_std::allocator<Point<float>_>_> local_68;
  anon_class_32_4_58ce38c5 local_50;
  
  local_88 = *(UtilizationWidget **)(*(long *)&this->field_0x20 + 0x1c);
  uStack_80 = 0;
  local_98 = *(PointF *)(*(long *)&this->field_0x20 + 0x14);
  uStack_90 = 0;
  local_a8.cspec = Invalid;
  local_a8.ct.argb.alpha = 0xffff;
  local_a8.ct.argb.red = 0;
  local_a8.ct._4_6_ = 0;
  QPen::QPen((QPen *)auStack_b8);
  QPen::setWidth((int)auStack_b8);
  local_ac.graphWidth = (float)(((int)local_88 - (int)local_98.x) + 1);
  local_6c.graphHeight = (float)((local_88._4_4_ - (int)local_98.y) + 1);
  local_50.xPos = &local_ac;
  local_98.y = local_6c.graphHeight;
  local_98.x = local_ac.graphWidth;
  uStack_90 = CONCAT44((float)((uStack_80._4_4_ - uStack_90._4_4_) + 1),
                       (float)(((int)uStack_80 - (int)uStack_90) + 1));
  local_50.yPos = &local_6c;
  local_50.color = &local_a8;
  lVar11 = 0;
  lVar10 = 0;
  local_88 = this;
  local_50.this = this;
  while( true ) {
    iVar6 = InfoProvider::getGPUCount();
    if (iVar6 <= lVar10) break;
    pQVar7 = SettingsManager::getGPUColor((int)lVar10);
    uVar1 = *(undefined8 *)pQVar7;
    local_a8.ct._4_6_ = (undefined6)((ulong)*(undefined8 *)((long)&pQVar7->ct + 2) >> 0x10);
    local_a8.cspec = (Spec)uVar1;
    local_a8.ct.argb.alpha = (ushort)((ulong)uVar1 >> 0x20);
    local_a8.ct.argb.red = (ushort)((ulong)uVar1 >> 0x30);
    QPen::setColor((QColor *)auStack_b8);
    QPainter::setPen((QPen *)&this->painter);
    pvVar2 = (local_88->graphPoints).ptr;
    bVar5 = SettingsManager::isSmoothGraph();
    points_00 = (vector<Point<float>,_std::allocator<Point<float>_>_> *)
                ((long)&(pvVar2->super__Vector_base<Point<float>,_std::allocator<Point<float>_>_>).
                        _M_impl.super__Vector_impl_data._M_start + lVar11);
    if (bVar5) {
      pfVar3 = *(float **)
                ((long)&(pvVar2->super__Vector_base<Point<float>,_std::allocator<Point<float>_>_>).
                        _M_impl.super__Vector_impl_data._M_start + lVar11);
      lVar4 = *(long *)((long)&(pvVar2->
                               super__Vector_base<Point<float>,_std::allocator<Point<float>_>_>).
                               _M_impl.super__Vector_impl_data._M_finish + lVar11);
      uVar8 = lVar4 - (long)pfVar3 >> 3;
      iVar9 = (int)(((*(float *)(lVar4 + -8) - *pfVar3) * local_ac.graphWidth) / 3.0);
      iVar6 = (int)uVar8;
      if (iVar6 <= iVar9) {
        iVar6 = iVar9;
      }
      if (uVar8 < (ulong)(long)iVar6) {
        PCHIPInterpolator::getInterpolatedPoints(&local_68,points_00,local_98,iVar6);
        UtilizationWidget::drawGraph::anon_class_32_4_58ce38c5::operator()(&local_50,&local_68);
        if (local_68.super__Vector_base<Point<float>,_std::allocator<Point<float>_>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68.super__Vector_base<Point<float>,_std::allocator<Point<float>_>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_68.
                                super__Vector_base<Point<float>,_std::allocator<Point<float>_>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_68.
                                super__Vector_base<Point<float>,_std::allocator<Point<float>_>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        UtilizationWidget::drawGraph::anon_class_32_4_58ce38c5::operator()(&local_50,points_00);
      }
    }
    else {
      UtilizationWidget::drawGraph::anon_class_32_4_58ce38c5::operator()(&local_50,points_00);
    }
    lVar10 = lVar10 + 1;
    lVar11 = lVar11 + 0x18;
  }
  QPen::~QPen((QPen *)auStack_b8);
  return;
}

Assistant:

void UtilizationWidget::drawGraph() {
    auto graphWidth = static_cast<float>(size().width());
    auto graphHeight = static_cast<float>(size().height());

    QColor color;
    QPen pen;
    pen.setWidth(2);

    auto xPos = [graphWidth](float x) { return x * graphWidth; };
    auto yPos = [graphHeight](float y) { return graphHeight - graphHeight * y; };

    auto drawGraph = [&](const std::vector<PointF> &points) {
        QPainterPath filling;

        auto pointPos = [&](PointF point) -> QPointF {
            return {xPos(point.x), yPos(point.y)};
        };

        filling.moveTo(pointPos(points[0]));

        for (size_t i = 1; i < points.size(); i++)
            filling.lineTo(pointPos(points[i]));

        painter.drawPath(filling);

        filling.lineTo(pointPos({1.0f, 0.0f}));
        filling.lineTo(pointPos({points[0].x, 0.0f}));
        filling.lineTo(pointPos({points[0].x, points[0].y}));

        color.setAlpha(64);
        painter.fillPath(filling, QBrush(color));
    };

    for (int g = 0; g < InfoProvider::getGPUCount(); g++) {
        color = SettingsManager::getGPUColor(g);
        pen.setColor(color);
        painter.setPen(pen);

        auto &gPoints = graphPoints[g];

        if (SettingsManager::isSmoothGraph()) {
            int count = std::max(
                static_cast<int>(gPoints.size()),
                static_cast<int>(xPos(gPoints.back().x - gPoints.front().x) / 3)
            );

            if (count > gPoints.size()) {
                auto points = PCHIPInterpolator::getInterpolatedPoints(gPoints, {graphWidth, graphHeight}, count);
                drawGraph(points);
            } else {
                drawGraph(gPoints);
            }
        } else {
            drawGraph(gPoints);
        }
    }
}